

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phmap_base.h
# Opt level: O2

CopyConst<char,_ElementType<1UL>_>_conflict15 * __thiscall
phmap::priv::internal_layout::
LayoutImpl<std::tuple<signed_char,phmap::priv::map_slot_type<cs_impl::any,cs::statement_block*>>,phmap::integer_sequence<unsigned_long,0ul,1ul>,phmap::integer_sequence<unsigned_long,0ul,1ul>>
::Pointer<1ul,char>(LayoutImpl<std::tuple<signed_char,phmap::priv::map_slot_type<cs_impl::any,cs::statement_block*>>,phmap::integer_sequence<unsigned_long,0ul,1ul>,phmap::integer_sequence<unsigned_long,0ul,1ul>>
                    *this,char *p)

{
  if (((ulong)p & 7) == 0) {
    return (CopyConst<char,_ElementType<1UL>_>_conflict15 *)
           (p + (*(long *)this + 7U & 0xfffffffffffffff8));
  }
  __assert_fail("reinterpret_cast<uintptr_t>(p) % alignment == 0",
                "/workspace/llm4binary/github/license_c_cmakelists/covscript[P]covscript/csbuild/deps/include/covscript/import/parallel_hashmap/phmap_base.h"
                ,0x1074,
                "CopyConst<Char, ElementType<N>> *phmap::priv::internal_layout::LayoutImpl<std::tuple<signed char, phmap::priv::map_slot_type<cs_impl::any, cs::statement_block *>>, phmap::integer_sequence<unsigned long, 0, 1>, phmap::integer_sequence<unsigned long, 0, 1>>::Pointer(Char *) const [Elements = std::tuple<signed char, phmap::priv::map_slot_type<cs_impl::any, cs::statement_block *>>, SizeSeq = phmap::integer_sequence<unsigned long, 0, 1>, OffsetSeq = phmap::integer_sequence<unsigned long, 0, 1>, N = 1UL, Char = char]"
               );
}

Assistant:

CopyConst<Char, ElementType<N>>* Pointer(Char* p) const
				{
					using C = typename std::remove_const<Char>::type;
					static_assert(
					    std::is_same<C, char>() || std::is_same<C, unsigned char>() ||
					    std::is_same<C, signed char>(),
					    "The argument must be a pointer to [const] [signed|unsigned] char");
					constexpr size_t alignment = Alignment();
					(void)alignment;
					assert(reinterpret_cast<uintptr_t>(p) % alignment == 0);
					return reinterpret_cast<CopyConst<Char, ElementType<N>>*>(p + Offset<N>());
				}